

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O0

vec<float,_4> linalg::slerp<float,4>(vec<float,_4> *a,vec<float,_4> *b,float t)

{
  vec<float,_4> *pvVar1;
  double dVar2;
  double dVar3;
  vec<float,_4> vVar4;
  float local_58;
  no_mm_apply_t<detail::op_mul,_linalg::vec<float,_4>,_float> local_54;
  float local_44;
  no_mm_apply_t<detail::op_mul,_linalg::vec<float,_4>,_float> local_40;
  float local_30;
  float local_2c;
  float th;
  float t_local;
  vec<float,_4> *b_local;
  vec<float,_4> *a_local;
  float local_10;
  float fStack_c;
  undefined1 auVar5 [12];
  
  local_2c = t;
  _th = b;
  b_local = a;
  local_30 = uangle<float,4>(a,b);
  pvVar1 = b_local;
  if ((local_30 != 0.0) || (NAN(local_30))) {
    dVar2 = std::sin((double)(ulong)(uint)(local_30 * (1.0 - local_2c)));
    dVar3 = std::sin((double)(ulong)(uint)local_30);
    local_44 = SUB84(dVar2,0) / SUB84(dVar3,0);
    local_40 = operator*(pvVar1,&local_44);
    pvVar1 = _th;
    dVar2 = std::sin((double)(ulong)(uint)(local_30 * local_2c));
    dVar3 = std::sin((double)(ulong)(uint)local_30);
    local_58 = SUB84(dVar2,0) / SUB84(dVar3,0);
    local_54 = operator*(pvVar1,&local_58);
    _a_local = operator+(&local_40,&local_54);
  }
  else {
    a_local._0_4_ = b_local->x;
    a_local._4_4_ = b_local->y;
    local_10 = b_local->z;
    fStack_c = b_local->w;
  }
  vVar4.x = a_local._0_4_;
  auVar5._4_4_ = a_local._4_4_;
  vVar4.z = local_10;
  vVar4.w = fStack_c;
  return vVar4;
}

Assistant:

vec<T,M>    slerp    (const vec<T,M> & a, const vec<T,M> & b, T t) { T th=uangle(a,b); return th == 0 ? a : a*(std::sin(th*(1-t))/std::sin(th)) + b*(std::sin(th*t)/std::sin(th)); }